

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O1

int av1_apply_selfguided_restoration_sse4_1
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  ushort *puVar11;
  ushort *puVar12;
  undefined1 (*pauVar13) [16];
  int32_t *piVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar17 [16];
  short sVar18;
  int iVar19;
  short sVar22;
  short sVar23;
  int iVar24;
  short sVar26;
  short sVar27;
  int iVar28;
  short sVar30;
  short sVar31;
  int iVar32;
  undefined1 auVar21 [16];
  short sVar34;
  int iVar35;
  int iVar37;
  int iVar39;
  int iVar40;
  undefined1 auVar36 [16];
  ushort uVar42;
  undefined1 in_XMM7 [16];
  undefined1 auVar41 [16];
  ushort uVar43;
  undefined1 in_XMM8 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int xq [2];
  int iVar20;
  int iVar25;
  int iVar29;
  int iVar33;
  uint uVar38;
  
  iVar7 = av1_selfguided_restoration_sse4_1
                    (dat8,width,height,stride,tmpbuf,tmpbuf + 0x27734,width,eps,bit_depth,highbd);
  if (iVar7 == 0) {
    av1_decode_xq(xqd,xq,av1_sgr_params + eps);
    if (0 < height) {
      auVar15._4_4_ = xq[1];
      auVar15._0_4_ = xq[1];
      auVar15._8_4_ = xq[1];
      auVar15._12_4_ = xq[1];
      auVar16 = ZEXT416((uint)~(-1 << ((byte)bit_depth & 0x1f)));
      auVar16 = pshuflw(auVar16,auVar16,0);
      puVar12 = (ushort *)((long)dst8 * 2);
      piVar14 = tmpbuf + 0x27738;
      pauVar9 = (undefined1 (*) [16])((long)dat8 * 2);
      uVar10 = 0;
      auVar17 = pmovsxwd(in_XMM4,0x400040004000400);
      do {
        if (0 < width) {
          iVar7 = av1_sgr_params[eps].r[0];
          iVar3 = av1_sgr_params[eps].r[1];
          lVar8 = 0;
          puVar11 = puVar12;
          pauVar13 = pauVar9;
          do {
            if (highbd == 0) {
              auVar41 = pmovzxbw(in_XMM7,*(undefined8 *)(dat8 + lVar8));
            }
            else {
              auVar41 = *pauVar13;
            }
            auVar41 = psllw(auVar41,4);
            in_XMM8 = pmovzxwd(in_XMM8,auVar41);
            in_XMM7._0_4_ = CONCAT22(0,auVar41._8_2_);
            in_XMM7._4_2_ = auVar41._10_2_;
            in_XMM7._6_2_ = 0;
            uVar42 = auVar41._12_2_;
            in_XMM7._8_2_ = uVar42;
            in_XMM7._10_2_ = 0;
            uVar43 = auVar41._14_2_;
            in_XMM7._12_2_ = uVar43;
            in_XMM7._14_2_ = 0;
            iVar20 = in_XMM8._0_4_;
            iVar19 = iVar20 * 0x80;
            iVar25 = in_XMM8._4_4_;
            iVar24 = iVar25 * 0x80;
            iVar29 = in_XMM8._8_4_;
            iVar33 = in_XMM8._12_4_;
            iVar28 = iVar29 * 0x80;
            iVar32 = iVar33 * 0x80;
            iVar35 = in_XMM7._0_4_ * 0x80;
            uVar38 = (uint)auVar41._10_2_;
            iVar37 = uVar38 * 0x80;
            iVar39 = (uint)uVar42 * 0x80;
            iVar40 = (uint)uVar43 * 0x80;
            if (0 < iVar7) {
              piVar1 = piVar14 + lVar8 + -0x27738;
              piVar2 = piVar14 + lVar8 + -0x27734;
              auVar44._0_4_ = *piVar1 - iVar20;
              auVar44._4_4_ = piVar1[1] - iVar25;
              auVar44._8_4_ = piVar1[2] - iVar29;
              auVar44._12_4_ = piVar1[3] - iVar33;
              auVar41._4_4_ = xq[0];
              auVar41._0_4_ = xq[0];
              auVar41._8_4_ = xq[0];
              auVar41._12_4_ = xq[0];
              auVar41 = pmulld(auVar44,auVar41);
              iVar19 = iVar19 + auVar41._0_4_;
              iVar24 = iVar24 + auVar41._4_4_;
              iVar28 = iVar28 + auVar41._8_4_;
              iVar32 = iVar32 + auVar41._12_4_;
              auVar46._0_4_ = *piVar2 - in_XMM7._0_4_;
              auVar46._4_4_ = piVar2[1] - uVar38;
              auVar46._8_4_ = piVar2[2] - (uint)uVar42;
              auVar46._12_4_ = piVar2[3] - (uint)uVar43;
              auVar6._4_4_ = xq[0];
              auVar6._0_4_ = xq[0];
              auVar6._8_4_ = xq[0];
              auVar6._12_4_ = xq[0];
              auVar41 = pmulld(auVar46,auVar6);
              iVar35 = iVar35 + auVar41._0_4_;
              iVar37 = iVar37 + auVar41._4_4_;
              iVar39 = iVar39 + auVar41._8_4_;
              iVar40 = iVar40 + auVar41._12_4_;
            }
            if (0 < iVar3) {
              piVar2 = piVar14 + lVar8 + -4;
              piVar1 = piVar14 + lVar8;
              auVar45._0_4_ = *piVar2 - iVar20;
              auVar45._4_4_ = piVar2[1] - iVar25;
              auVar45._8_4_ = piVar2[2] - iVar29;
              auVar45._12_4_ = piVar2[3] - iVar33;
              auVar41 = pmulld(auVar45,auVar15);
              iVar19 = iVar19 + auVar41._0_4_;
              iVar24 = iVar24 + auVar41._4_4_;
              iVar28 = iVar28 + auVar41._8_4_;
              iVar32 = iVar32 + auVar41._12_4_;
              auVar47._0_4_ = *piVar1 - in_XMM7._0_4_;
              auVar47._4_4_ = piVar1[1] - uVar38;
              auVar47._8_4_ = piVar1[2] - (uint)uVar42;
              auVar47._12_4_ = piVar1[3] - (uint)uVar43;
              auVar41 = pmulld(auVar47,auVar15);
              iVar35 = iVar35 + auVar41._0_4_;
              iVar37 = iVar37 + auVar41._4_4_;
              iVar39 = iVar39 + auVar41._8_4_;
              iVar40 = iVar40 + auVar41._12_4_;
            }
            auVar21._0_4_ = iVar19 + auVar17._0_4_ >> 0xb;
            auVar21._4_4_ = iVar24 + auVar17._4_4_ >> 0xb;
            auVar21._8_4_ = iVar28 + auVar17._8_4_ >> 0xb;
            auVar21._12_4_ = iVar32 + auVar17._12_4_ >> 0xb;
            auVar36._0_4_ = iVar35 + auVar17._0_4_ >> 0xb;
            auVar36._4_4_ = iVar37 + auVar17._4_4_ >> 0xb;
            auVar36._8_4_ = iVar39 + auVar17._8_4_ >> 0xb;
            auVar36._12_4_ = iVar40 + auVar17._12_4_ >> 0xb;
            if (highbd == 0) {
              auVar41 = packssdw(auVar21,auVar36);
              sVar4 = auVar41._0_2_;
              sVar5 = auVar41._2_2_;
              sVar18 = auVar41._4_2_;
              sVar22 = auVar41._6_2_;
              sVar23 = auVar41._8_2_;
              sVar26 = auVar41._10_2_;
              sVar27 = auVar41._12_2_;
              sVar30 = auVar41._14_2_;
              *(ulong *)(dst8 + lVar8) =
                   CONCAT17((0 < sVar30) * (sVar30 < 0x100) * auVar41[0xe] - (0xff < sVar30),
                            CONCAT16((0 < sVar27) * (sVar27 < 0x100) * auVar41[0xc] -
                                     (0xff < sVar27),
                                     CONCAT15((0 < sVar26) * (sVar26 < 0x100) * auVar41[10] -
                                              (0xff < sVar26),
                                              CONCAT14((0 < sVar23) * (sVar23 < 0x100) * auVar41[8]
                                                       - (0xff < sVar23),
                                                       CONCAT13((0 < sVar22) * (sVar22 < 0x100) *
                                                                auVar41[6] - (0xff < sVar22),
                                                                CONCAT12((0 < sVar18) *
                                                                         (sVar18 < 0x100) *
                                                                         auVar41[4] -
                                                                         (0xff < sVar18),
                                                                         CONCAT11((0 < sVar5) *
                                                                                  (sVar5 < 0x100) *
                                                                                  auVar41[2] -
                                                                                  (0xff < sVar5),
                                                                                  (0 < sVar4) *
                                                                                  (sVar4 < 0x100) *
                                                                                  auVar41[0] -
                                                                                  (0xff < sVar4)))))
                                             )));
            }
            else {
              auVar41 = packusdw(auVar21,auVar36);
              sVar4 = auVar16._0_2_;
              sVar18 = auVar41._0_2_;
              sVar5 = auVar16._2_2_;
              sVar22 = auVar41._2_2_;
              sVar23 = auVar41._4_2_;
              sVar26 = auVar41._6_2_;
              sVar27 = auVar41._8_2_;
              sVar30 = auVar41._10_2_;
              sVar31 = auVar41._12_2_;
              sVar34 = auVar41._14_2_;
              *puVar11 = (ushort)(sVar4 < sVar18) * sVar4 | (ushort)(sVar4 >= sVar18) * sVar18;
              puVar11[1] = (ushort)(sVar5 < sVar22) * sVar5 | (ushort)(sVar5 >= sVar22) * sVar22;
              puVar11[2] = (ushort)(sVar4 < sVar23) * sVar4 | (ushort)(sVar4 >= sVar23) * sVar23;
              puVar11[3] = (ushort)(sVar5 < sVar26) * sVar5 | (ushort)(sVar5 >= sVar26) * sVar26;
              puVar11[4] = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
              puVar11[5] = (ushort)(sVar5 < sVar30) * sVar5 | (ushort)(sVar5 >= sVar30) * sVar30;
              puVar11[6] = (ushort)(sVar4 < sVar31) * sVar4 | (ushort)(sVar4 >= sVar31) * sVar31;
              puVar11[7] = (ushort)(sVar5 < sVar34) * sVar5 | (ushort)(sVar5 >= sVar34) * sVar34;
            }
            lVar8 = lVar8 + 8;
            puVar11 = puVar11 + 8;
            pauVar13 = pauVar13 + 1;
          } while (lVar8 < width);
        }
        uVar10 = uVar10 + 1;
        puVar12 = puVar12 + dst_stride;
        dst8 = dst8 + dst_stride;
        piVar14 = piVar14 + width;
        dat8 = dat8 + stride;
        pauVar9 = (undefined1 (*) [16])(*pauVar9 + (long)stride * 2);
      } while (uVar10 != (uint)height);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int av1_apply_selfguided_restoration_sse4_1(const uint8_t *dat8, int width,
                                            int height, int stride, int eps,
                                            const int *xqd, uint8_t *dst8,
                                            int dst_stride, int32_t *tmpbuf,
                                            int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);
  const int ret = av1_selfguided_restoration_sse4_1(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);

  __m128i xq0 = _mm_set1_epi32(xq[0]);
  __m128i xq1 = _mm_set1_epi32(xq[1]);

  for (int i = 0; i < height; ++i) {
    // Calculate output in batches of 8 pixels
    for (int j = 0; j < width; j += 8) {
      const int k = i * width + j;
      const int m = i * dst_stride + j;

      const uint8_t *dat8ij = dat8 + i * stride + j;
      __m128i src;
      if (highbd) {
        src = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij));
      } else {
        src = _mm_cvtepu8_epi16(xx_loadl_64(dat8ij));
      }

      const __m128i u = _mm_slli_epi16(src, SGRPROJ_RST_BITS);
      const __m128i u_0 = _mm_cvtepu16_epi32(u);
      const __m128i u_1 = _mm_cvtepu16_epi32(_mm_srli_si128(u, 8));

      __m128i v_0 = _mm_slli_epi32(u_0, SGRPROJ_PRJ_BITS);
      __m128i v_1 = _mm_slli_epi32(u_1, SGRPROJ_PRJ_BITS);

      if (params->r[0] > 0) {
        const __m128i f1_0 = _mm_sub_epi32(xx_loadu_128(&flt0[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq0, f1_0));

        const __m128i f1_1 = _mm_sub_epi32(xx_loadu_128(&flt0[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq0, f1_1));
      }

      if (params->r[1] > 0) {
        const __m128i f2_0 = _mm_sub_epi32(xx_loadu_128(&flt1[k]), u_0);
        v_0 = _mm_add_epi32(v_0, _mm_mullo_epi32(xq1, f2_0));

        const __m128i f2_1 = _mm_sub_epi32(xx_loadu_128(&flt1[k + 4]), u_1);
        v_1 = _mm_add_epi32(v_1, _mm_mullo_epi32(xq1, f2_1));
      }

      const __m128i rounding =
          round_for_shift(SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_0 = _mm_srai_epi32(_mm_add_epi32(v_0, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m128i w_1 = _mm_srai_epi32(_mm_add_epi32(v_1, rounding),
                                         SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      if (highbd) {
        // Pack into 16 bits and clamp to [0, 2^bit_depth)
        const __m128i tmp = _mm_packus_epi32(w_0, w_1);
        const __m128i max = _mm_set1_epi16((1 << bit_depth) - 1);
        const __m128i res = _mm_min_epi16(tmp, max);
        xx_storeu_128(CONVERT_TO_SHORTPTR(dst8 + m), res);
      } else {
        // Pack into 8 bits and clamp to [0, 256)
        const __m128i tmp = _mm_packs_epi32(w_0, w_1);
        const __m128i res = _mm_packus_epi16(tmp, tmp /* "don't care" value */);
        xx_storel_64(dst8 + m, res);
      }
    }
  }
  return 0;
}